

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O0

void __thiscall
QColorTransformPrivate::apply<unsigned_char,unsigned_char>
          (QColorTransformPrivate *this,uchar *dst,uchar *src,qsizetype count,TransformFlags flags)

{
  long lVar1;
  bool bVar2;
  QColorSpacePrivate *pQVar3;
  longlong *plVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  QColorTransformPrivate *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  qsizetype len;
  qsizetype i;
  QUninitialized<QColorVector,_256> buffer;
  long len_00;
  QColorVector *in_stack_ffffffffffffef98;
  QColorVector *in_stack_ffffffffffffefa0;
  QColorTransformPrivate *this_00;
  QColorTransformPrivate *in_stack_ffffffffffffefb8;
  QColorTransformPrivate *this_01;
  long local_1018;
  undefined4 in_stack_ffffffffffffeff0;
  QUninitialized local_1008 [4];
  QFlagsStorage<QColorTransformPrivate::TransformFlag> in_stack_ffffffffffffeffc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
                     ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x4d3c48);
  bVar2 = QColorSpacePrivate::isThreeComponentMatrix(pQVar3);
  if (bVar2) {
    updateLutsIn(in_stack_ffffffffffffefb8);
  }
  pQVar3 = QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
                     ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x4d3c6e);
  bVar2 = QColorSpacePrivate::isThreeComponentMatrix(pQVar3);
  if (bVar2) {
    updateLutsOut(in_stack_ffffffffffffefb8);
  }
  for (this_01 = (QColorTransformPrivate *)0x0; (long)this_01 < in_RCX;
      this_01 = (QColorTransformPrivate *)
                ((long)&(this_01->super_QSharedData).ref.super_QAtomicInteger<int>.
                        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
                (long)&(this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i)) {
    local_1018 = in_RCX - (long)this_01;
    plVar4 = qMin<long_long>(&local_1018,&WorkBlockSize);
    this_00 = (QColorTransformPrivate *)*plVar4;
    len_00 = (long)&(this_01->super_QSharedData).ref.super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + in_RDX;
    QUninitialized::operator_cast_to_QColorVector_(local_1008);
    applyConvertIn<unsigned_char>
              (this_01,(uchar *)this_00,(QColorVector *)CONCAT44(in_R8D,in_stack_ffffffffffffeff0),
               (qsizetype)in_RDI,(TransformFlags)in_stack_ffffffffffffeffc.i);
    QUninitialized::operator_cast_to_QColorVector_(local_1008);
    pcsAdapt(in_RDI,in_stack_ffffffffffffefa0,(qsizetype)in_stack_ffffffffffffef98);
    in_stack_ffffffffffffef98 =
         (QColorVector *)
         ((long)&(this_01->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + in_RSI);
    in_stack_ffffffffffffefa0 =
         (QColorVector *)
         ((long)&(this_01->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + in_RDX);
    QUninitialized::operator_cast_to_QColorVector_(local_1008);
    applyConvertOut<unsigned_char,unsigned_char>
              (this_00,(uchar *)in_RDI,(uchar *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98,
               len_00,(QFlagsStorageHelper<QColorTransformPrivate::TransformFlag,_4>)
                      SUB84((ulong)this_01 >> 0x20,0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorTransformPrivate::apply(D *dst, const S *src, qsizetype count, TransformFlags flags) const
{
    if (colorSpaceIn->isThreeComponentMatrix())
        updateLutsIn();
    if (colorSpaceOut->isThreeComponentMatrix())
        updateLutsOut();

    Q_DECL_UNINITIALIZED QUninitialized<QColorVector, WorkBlockSize> buffer;
    qsizetype i = 0;
    while (i < count) {
        const qsizetype len = qMin(count - i, WorkBlockSize);

        applyConvertIn(src + i, buffer, len, flags);

        pcsAdapt(buffer, len);

        applyConvertOut(dst + i, src + i, buffer, len, flags);

        i += len;
    }
}